

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gym_Emu.cpp
# Opt level: O2

void __thiscall Gym_Emu::parse_frame(Gym_Emu *this)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  byte *pbVar5;
  byte *pbVar6;
  uint dac_count;
  
  if ((this->loop_remain != 0) &&
     (iVar4 = this->loop_remain + -1, this->loop_remain = iVar4, iVar4 == 0)) {
    this->loop_begin = this->pos;
  }
  dac_count = 0;
  pbVar6 = this->pos;
  while( true ) {
    pbVar5 = pbVar6;
    pbVar6 = pbVar5 + 1;
    bVar1 = *pbVar5;
    if (bVar1 == '\0') break;
    bVar2 = pbVar5[1];
    if (bVar1 == '\x03') {
      Sms_Apu::write_data(&this->apu,0,(uint)bVar2);
      pbVar6 = pbVar5 + 2;
    }
    else if (bVar1 == '\x02') {
      Ym2612_Emu::write1(&this->fm,(uint)bVar2,(uint)pbVar5[2]);
      pbVar6 = pbVar5 + 3;
    }
    else if (bVar1 == '\x01') {
      bVar3 = pbVar5[2];
      pbVar6 = pbVar5 + 3;
      if (bVar2 == 0x2a) {
        if (dac_count < 0x400) {
          this->dac_buf[dac_count] = bVar3;
          dac_count = dac_count + this->dac_enabled;
        }
      }
      else {
        if (bVar2 == 0x2b) {
          this->dac_enabled = (bool)(bVar3 >> 7);
        }
        Ym2612_Emu::write0(&this->fm,(uint)bVar2,(uint)bVar3);
      }
    }
  }
  pbVar5 = pbVar6;
  if ((this->data_end <= pbVar6) && (pbVar5 = this->loop_begin, this->loop_begin == (byte *)0x0)) {
    (this->super_Music_Emu).emu_track_ended_ = true;
    pbVar5 = pbVar6;
  }
  this->pos = pbVar5;
  if ((dac_count != 0) && (this->dac_muted == false)) {
    run_dac(this,dac_count);
  }
  this->prev_dac_count = dac_count;
  return;
}

Assistant:

void Gym_Emu::parse_frame()
{
	int dac_count = 0;
	const byte* pos = this->pos;
	
	if ( loop_remain && !--loop_remain )
		loop_begin = pos; // find loop on first time through sequence
	
	int cmd;
	while ( (cmd = *pos++) != 0 )
	{
		int data = *pos++;
		if ( cmd == 1 )
		{
			int data2 = *pos++;
			if ( data != 0x2A )
			{
				if ( data == 0x2B )
					dac_enabled = (data2 & 0x80) != 0;
				
				fm.write0( data, data2 );
			}
			else if ( dac_count < (int) sizeof dac_buf )
			{
				dac_buf [dac_count] = data2;
				dac_count += dac_enabled;
			}
		}
		else if ( cmd == 2 )
		{
			fm.write1( data, *pos++ );
		}
		else if ( cmd == 3 )
		{
			apu.write_data( 0, data );
		}
		else
		{
			// to do: many GYM streams are full of errors, and error count should
			// reflect cases where music is really having problems
			//log_error(); 
			--pos; // put data back
		}
	}
	
	// loop
	if ( pos >= data_end )
	{
		check( pos == data_end );
		
		if ( loop_begin )
			pos = loop_begin;
		else
			set_track_ended();
	}
	this->pos = pos;
	
	// dac
	if ( dac_count && !dac_muted )
		run_dac( dac_count );
	prev_dac_count = dac_count;
}